

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcopy_to_ucol.c
# Opt level: O3

int zcopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,doublecomplex *dense,
                 GlobalLU_t *Glu)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  int_t iVar5;
  int_t next;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int_t *piVar11;
  int iVar12;
  int *piVar13;
  int_t nzumax;
  doublecomplex zero;
  int local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int_t *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  int_t *local_88;
  int_t *local_80;
  ulong local_78;
  void *local_70;
  int *local_68;
  long local_60;
  int_t *local_58;
  ulong local_50;
  double local_48;
  double dStack_40;
  
  local_48 = 0.0;
  dStack_40 = 0.0;
  piVar9 = Glu->xsup;
  piVar13 = Glu->supno;
  local_80 = Glu->lsub;
  piVar11 = Glu->xlsub;
  local_70 = Glu->ucol;
  local_88 = Glu->usub;
  local_58 = Glu->xusub;
  local_d4 = Glu->nzumax;
  local_60 = (long)jcol;
  local_c8 = (ulong)(uint)local_58[local_60];
  if (0 < nseg) {
    local_d0 = piVar13[local_60];
    local_78 = (ulong)(uint)nseg;
    iVar6 = 0;
    local_cc = nseg;
    local_b8 = jcol;
    local_b0 = piVar11;
    local_a8 = piVar13;
    local_a0 = piVar9;
    local_98 = segrep;
    local_90 = repfnz;
    local_68 = perm_r;
    iVar7 = local_d0;
    do {
      uVar2 = segrep[local_78 - 1];
      if ((piVar13[(int)uVar2] != iVar7) && (local_bc = repfnz[(int)uVar2], local_bc != -1)) {
        local_c0 = (local_bc - piVar9[piVar13[(int)uVar2]]) + piVar11[piVar9[piVar13[(int)uVar2]]];
        local_50 = (ulong)(uVar2 - local_bc);
        local_b4 = (uVar2 - local_bc) + (int)local_c8 + 1;
        if (local_d4 < local_b4) {
          do {
            iVar7 = local_b8;
            next = (int_t)local_c8;
            iVar5 = zLUMemXpand(local_b8,next,UCOL,&local_d4,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
            local_70 = Glu->ucol;
            iVar5 = zLUMemXpand(iVar7,next,USUB,&local_d4,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
          } while (local_d4 < local_b4);
          local_80 = Glu->lsub;
          local_88 = Glu->usub;
        }
        repfnz = local_90;
        segrep = local_98;
        piVar9 = local_a0;
        piVar11 = local_b0;
        piVar13 = local_a8;
        nseg = local_cc;
        iVar7 = local_d0;
        if (-1 < (int)local_50) {
          iVar12 = (int)local_c8;
          iVar10 = 0;
          lVar8 = 0;
          do {
            iVar3 = *(int *)((long)local_80 + lVar8 + (long)local_c0 * 4);
            *(int *)((long)local_88 + lVar8 + (long)iVar12 * 4) = local_68[iVar3];
            dVar4 = dense[iVar3].i;
            pdVar1 = (double *)((long)local_70 + lVar8 * 4 + (long)iVar12 * 0x10);
            *pdVar1 = dense[iVar3].r;
            pdVar1[1] = dVar4;
            dense[iVar3].r = local_48;
            dense[iVar3].i = dStack_40;
            lVar8 = lVar8 + 4;
            iVar10 = iVar10 + -1;
          } while (~uVar2 + local_bc != iVar10);
          local_c8 = (ulong)(uint)(iVar12 - iVar10);
        }
      }
      local_78 = local_78 - 1;
      iVar6 = iVar6 + 1;
    } while (iVar6 != nseg);
  }
  local_58[local_60 + 1] = (int_t)local_c8;
  return 0;
}

Assistant:

int
zcopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      doublecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    doublecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    doublecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = zLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (doublecomplex *) Glu->ucol;
		    mem_error = zLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}